

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

bool google::protobuf::compiler::cpp::anon_unknown_0::IsPOD(FieldDescriptor *field)

{
  byte bVar1;
  CppType CVar2;
  
  if (((byte)field[1] & 8) == 0 && (~(byte)field[1] & 0x60) != 0) {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 < CPPTYPE_MESSAGE) {
      bVar1 = (byte)(0x1fe >> ((byte)CVar2 & 0x1f));
      goto LAB_002df494;
    }
  }
  bVar1 = 0;
LAB_002df494:
  return (bool)(bVar1 & 1);
}

Assistant:

inline FieldDescriptor::Label FieldDescriptor::label() const {
  return static_cast<Label>(label_);
}